

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

FMStructDescList combineCpDpFormats(FMStructDescList top,FMStructDescList cp,FMStructDescList dp)

{
  uint uVar1;
  char **ppcVar2;
  void *__ptr;
  FMStructDescList p_Var3;
  char *pcVar4;
  undefined8 uVar5;
  int repl_size;
  uint uVar6;
  ulong uVar7;
  int repl_size_00;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  
  __ptr = (void *)FMcopy_struct_list();
  uVar9 = 0;
  uVar6 = 0;
  if (top->format_name != (char *)0x0) {
    p_Var3 = top + 1;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + 1;
      ppcVar2 = &p_Var3->format_name;
      p_Var3 = p_Var3 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  if (cp != (FMStructDescList)0x0) {
    uVar9 = 0xffffffff;
    p_Var3 = cp;
    do {
      uVar9 = uVar9 + 1;
      ppcVar2 = &p_Var3->format_name;
      p_Var3 = p_Var3 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  if (dp == (FMStructDescList)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0xffffffff;
    p_Var3 = dp;
    do {
      uVar8 = (ulong)((int)uVar8 + 1);
      ppcVar2 = &p_Var3->format_name;
      p_Var3 = p_Var3 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  uVar1 = uVar9 + uVar6;
  uVar7 = (ulong)((int)uVar8 + uVar1);
  p_Var3 = (FMStructDescList)realloc(__ptr,uVar7 * 0x20 + 0x20);
  if (uVar9 != 0) {
    lVar10 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&cp->format_name + lVar10));
      *(char **)((long)&p_Var3[uVar6].format_name + lVar10) = pcVar4;
      uVar5 = copy_field_list(*(undefined8 *)((long)&cp->field_list + lVar10));
      *(undefined8 *)((long)&p_Var3[uVar6].field_list + lVar10) = uVar5;
      *(undefined4 *)((long)&p_Var3[uVar6].struct_size + lVar10) =
           *(undefined4 *)((long)&cp->struct_size + lVar10);
      *(undefined8 *)((long)&p_Var3[uVar6].opt_info + lVar10) = 0;
      lVar10 = lVar10 + 0x20;
    } while ((ulong)uVar9 << 5 != lVar10);
  }
  if ((int)uVar8 != 0) {
    lVar10 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&dp->format_name + lVar10));
      *(char **)((long)&p_Var3[uVar1].format_name + lVar10) = pcVar4;
      uVar5 = copy_field_list(*(undefined8 *)((long)&dp->field_list + lVar10));
      *(undefined8 *)((long)&p_Var3[uVar1].field_list + lVar10) = uVar5;
      *(undefined4 *)((long)&p_Var3[uVar1].struct_size + lVar10) =
           *(undefined4 *)((long)&dp->struct_size + lVar10);
      *(undefined8 *)((long)&p_Var3[uVar1].opt_info + lVar10) = 0;
      lVar10 = lVar10 + 0x20;
    } while (uVar8 << 5 != lVar10);
  }
  repl_size_00 = 0;
  p_Var3[uVar7].opt_info = (FMOptInfo *)0x0;
  p_Var3[uVar7].format_name = (char *)0x0;
  p_Var3[uVar7].field_list = (FMFieldList)0x0;
  p_Var3[uVar7].struct_size = 0;
  if (cp == (FMStructDescList)0x0) {
    pcVar4 = (char *)0x0;
    repl_size = 0;
  }
  else {
    pcVar4 = cp->format_name;
    repl_size = cp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var3,"CP_STRUCT",pcVar4,repl_size);
  if (dp == (FMStructDescList)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = dp->format_name;
    repl_size_00 = dp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var3,"DP_STRUCT",pcVar4,repl_size_00);
  return p_Var3;
}

Assistant:

static FMStructDescList combineCpDpFormats(FMStructDescList top, FMStructDescList cp,
                                           FMStructDescList dp)
{
    int i = 0, topCount = 0, cpCount = 0, dpCount = 0;
    FMStructDescList CombinedFormats = FMcopy_struct_list(top);

    i = 0;
    while (top[i++].format_name)
        topCount++;

    i = 0;
    while (cp && cp[i++].format_name)
        cpCount++;

    i = 0;
    while (dp && dp[i++].format_name)
        dpCount++;

    CombinedFormats =
        realloc(CombinedFormats, sizeof(CombinedFormats[0]) * (topCount + cpCount + dpCount + 1));
    for (i = 0; i < cpCount; i++)
    {
        CombinedFormats[topCount + i].format_name = strdup(cp[i].format_name);
        CombinedFormats[topCount + i].field_list = copy_field_list(cp[i].field_list);
        CombinedFormats[topCount + i].struct_size = cp[i].struct_size;
        CombinedFormats[topCount + i].opt_info = NULL;
    }

    for (i = 0; i < dpCount; i++)
    {
        CombinedFormats[topCount + cpCount + i].format_name = strdup(dp[i].format_name);
        CombinedFormats[topCount + cpCount + i].field_list = copy_field_list(dp[i].field_list);
        CombinedFormats[topCount + cpCount + i].struct_size = dp[i].struct_size;
        CombinedFormats[topCount + cpCount + i].opt_info = NULL;
    }
    CombinedFormats[topCount + cpCount + dpCount].format_name = NULL;
    CombinedFormats[topCount + cpCount + dpCount].field_list = NULL;
    CombinedFormats[topCount + cpCount + dpCount].struct_size = 0;
    CombinedFormats[topCount + cpCount + dpCount].opt_info = NULL;

    replaceFormatNameInFieldList(CombinedFormats, "CP_STRUCT", cp ? cp[0].format_name : NULL,
                                 cp ? cp[0].struct_size : 0);
    replaceFormatNameInFieldList(CombinedFormats, "DP_STRUCT", dp ? dp[0].format_name : NULL,
                                 dp ? dp[0].struct_size : 0);
    return CombinedFormats;
}